

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O1

void tcg_gen_vec_sar16i_i64_riscv32(TCGContext_conflict9 *tcg_ctx,TCGv_i64 d,TCGv_i64 a,int64_t c)

{
  TCGTemp *ts;
  byte bVar1;
  TCGv_i64 ret;
  uintptr_t o;
  
  bVar1 = (byte)c;
  ts = tcg_temp_new_internal_riscv32(tcg_ctx,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)ts - (long)tcg_ctx);
  tcg_gen_shri_i64_riscv32(tcg_ctx,d,a,c);
  tcg_gen_andi_i64_riscv32(tcg_ctx,ret,d,(ulong)(0x8000 >> (bVar1 & 0x1f)) * 0x1000100010001);
  tcg_gen_andi_i64_riscv32(tcg_ctx,d,d,(ulong)(0xffff >> (bVar1 & 0x1f)) * 0x1000100010001);
  tcg_gen_muli_i64_riscv32(tcg_ctx,ret,ret,(long)((2 << (bVar1 & 0x1f)) + -2));
  tcg_gen_op3_riscv32(tcg_ctx,INDEX_op_or_i64,(TCGArg)(d + (long)tcg_ctx),
                      (TCGArg)(d + (long)tcg_ctx),(TCGArg)ts);
  tcg_temp_free_internal_riscv32(tcg_ctx,ts);
  return;
}

Assistant:

void tcg_gen_vec_sar16i_i64(TCGContext *tcg_ctx, TCGv_i64 d, TCGv_i64 a, int64_t c)
{
    uint64_t s_mask = dup_const(MO_16, 0x8000 >> c);
    uint64_t c_mask = dup_const(MO_16, 0xffff >> c);
    TCGv_i64 s = tcg_temp_new_i64(tcg_ctx);

    tcg_gen_shri_i64(tcg_ctx, d, a, c);
    tcg_gen_andi_i64(tcg_ctx, s, d, s_mask);  /* isolate (shifted) sign bit */
    tcg_gen_andi_i64(tcg_ctx, d, d, c_mask);  /* clear out bits above sign  */
    tcg_gen_muli_i64(tcg_ctx, s, s, (2 << c) - 2); /* replicate isolated signs */
    tcg_gen_or_i64(tcg_ctx, d, d, s);         /* include sign extension */
    tcg_temp_free_i64(tcg_ctx, s);
}